

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_slice(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int splice)

{
  bool bVar1;
  JSValue v_00;
  JSValue val_00;
  JSValue val_01;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue obj_00;
  JSValue val_02;
  JSValue val_03;
  JSValue val_04;
  JSValue val_05;
  JSValue val_06;
  JSValue val_07;
  JSValue this_obj_01;
  JSValue this_obj_02;
  JSValue this_obj_03;
  JSValue obj_01;
  JSValue obj_02;
  JSValue val_08;
  JSValue len_val_00;
  JSValue obj_03;
  JSValue v_04;
  JSValue obj_04;
  JSValue obj_05;
  JSValue JVar2;
  int iVar3;
  BOOL BVar4;
  int in_ECX;
  long lVar5;
  JSValueUnion in_RDI;
  long in_R8;
  int in_R9D;
  JSValue JVar6;
  uint32_t item_count;
  uint32_t i;
  uint32_t count32;
  JSValue *arrp;
  int kPresent;
  int64_t new_len;
  int64_t del_count;
  int64_t count;
  int64_t n;
  int64_t final;
  int64_t k;
  int64_t start;
  int64_t len;
  JSValue len_val;
  JSValue val;
  JSValue arr;
  JSValue obj;
  JSValue v_2;
  JSValue v_1;
  JSValue v;
  undefined4 local_2d8;
  JSAtom prop;
  JSContext *in_stack_fffffffffffffd30;
  int32_t in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  JSValueUnion in_stack_fffffffffffffd40;
  JSValueUnion in_stack_fffffffffffffd48;
  JSContext *in_stack_fffffffffffffd50;
  JSValueUnion JVar7;
  JSValueUnion in_stack_fffffffffffffd58;
  JSContext *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  JSValueUnion in_stack_fffffffffffffd70;
  int64_t in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd80 [16];
  JSContext *in_stack_fffffffffffffd90;
  JSValueUnion JVar8;
  JSValueUnion in_stack_fffffffffffffd98;
  JSValueUnion in_stack_fffffffffffffda0;
  JSValueUnion local_250;
  int64_t local_248;
  JSContext *in_stack_fffffffffffffdc0;
  JSValueUnion in_stack_fffffffffffffdc8;
  int64_t in_stack_fffffffffffffdd0;
  int flags;
  undefined4 uVar9;
  int64_t iVar10;
  undefined4 uVar11;
  uint in_stack_fffffffffffffdf4;
  undefined8 uVar12;
  undefined4 in_stack_fffffffffffffe00;
  uint uVar13;
  uint uVar14;
  uint in_stack_fffffffffffffe0c;
  JSValue *local_1f0;
  int local_1e4;
  long local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  JSContext *local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  JSValueUnion local_1a0;
  int64_t local_198;
  JSValueUnion local_180;
  int64_t local_178;
  JSValueUnion local_170;
  int64_t local_168;
  int local_15c;
  long local_158;
  int local_14c;
  JSValueUnion local_148;
  int32_t local_130;
  undefined4 uStack_12c;
  int64_t local_128;
  JSValueUnion local_120;
  int64_t local_118;
  JSValueUnion local_110;
  undefined8 local_108;
  long local_100;
  JSValueUnion local_f8;
  JSValueUnion local_f0;
  int64_t local_e8;
  int local_dc;
  JSValueUnion local_d8;
  int local_d0;
  undefined4 uStack_cc;
  undefined8 local_c8;
  JSValueUnion local_c0;
  int64_t local_b8;
  JSValueUnion local_b0;
  undefined8 local_a8;
  JSContext *local_a0;
  JSValueUnion local_98;
  JSValueUnion local_90;
  int64_t local_88;
  int local_7c;
  JSValueUnion local_78;
  int local_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  JSValueUnion local_60;
  int64_t local_58;
  JSValueUnion local_50;
  undefined8 local_48;
  ulong local_40;
  JSValueUnion local_38;
  JSValueUnion local_30;
  int64_t local_28;
  int local_1c;
  JSValueUnion local_18;
  int local_10;
  undefined4 uStack_c;
  undefined8 local_8;
  
  uVar11 = 0;
  uVar12 = 3;
  local_180.ptr = (void *)((ulong)in_stack_fffffffffffffdf4 << 0x20);
  local_178 = 3;
  val_08.tag = in_stack_fffffffffffffdd0;
  val_08.u.float64 = in_stack_fffffffffffffdc8.float64;
  local_15c = in_R9D;
  local_158 = in_R8;
  local_14c = in_ECX;
  local_148 = in_RDI;
  JVar6 = JS_ToObject(in_stack_fffffffffffffdc0,val_08);
  flags = JVar6.u._0_4_;
  uVar9 = JVar6.u._4_4_;
  iVar10 = JVar6.tag;
  local_170 = JVar6.u;
  JVar6.tag = (int64_t)in_stack_fffffffffffffd60;
  JVar6.u.ptr = in_stack_fffffffffffffd58.ptr;
  local_168 = iVar10;
  iVar3 = js_get_length64(in_stack_fffffffffffffd50,(int64_t *)in_stack_fffffffffffffd48.ptr,JVar6);
  if (iVar3 == 0) {
    _local_2d8 = local_1a8;
    val_05.u._7_1_ = in_stack_fffffffffffffd6f;
    val_05.u._0_7_ = in_stack_fffffffffffffd68;
    val_05.tag = (int64_t)in_stack_fffffffffffffd70.ptr;
    iVar3 = JS_ToInt64Clamp(in_stack_fffffffffffffd60,(int64_t *)in_stack_fffffffffffffd58.ptr,
                            val_05,(int64_t)in_stack_fffffffffffffd50,
                            (int64_t)in_stack_fffffffffffffd48,in_stack_fffffffffffffd80._0_8_);
    if (iVar3 == 0) {
      if (local_15c == 0) {
        uVar13 = 0;
        local_1c0 = local_1a8;
        iVar3 = JS_IsUndefined(*(JSValue *)(local_158 + 0x10));
        if (iVar3 == 0) {
          _local_2d8 = local_1a8;
          val_07.u._7_1_ = in_stack_fffffffffffffd6f;
          val_07.u._0_7_ = in_stack_fffffffffffffd68;
          val_07.tag = (int64_t)in_stack_fffffffffffffd70.ptr;
          iVar3 = JS_ToInt64Clamp(in_stack_fffffffffffffd60,(int64_t *)in_stack_fffffffffffffd58.ptr
                                  ,val_07,(int64_t)in_stack_fffffffffffffd50,
                                  (int64_t)in_stack_fffffffffffffd48,in_stack_fffffffffffffd80._0_8_
                                 );
          if (iVar3 != 0) goto LAB_001b2879;
        }
        local_1d0 = max_int64(local_1c0 - local_1b0,0);
      }
      else {
        if (local_14c == 0) {
          uVar13 = 0;
          local_1d8 = 0;
        }
        else if (local_14c == 1) {
          uVar13 = 0;
          local_1d8 = local_1a8 - local_1b0;
        }
        else {
          uVar13 = local_14c - 2;
          _local_2d8 = 0;
          val_06.u._7_1_ = in_stack_fffffffffffffd6f;
          val_06.u._0_7_ = in_stack_fffffffffffffd68;
          val_06.tag = (int64_t)in_stack_fffffffffffffd70.ptr;
          iVar3 = JS_ToInt64Clamp(in_stack_fffffffffffffd60,(int64_t *)in_stack_fffffffffffffd58.ptr
                                  ,val_06,(int64_t)in_stack_fffffffffffffd50,
                                  (int64_t)in_stack_fffffffffffffd48,in_stack_fffffffffffffd80._0_8_
                                 );
          if (iVar3 != 0) goto LAB_001b2879;
        }
        if (0x1fffffffffffff < (long)((local_1a8 + (ulong)uVar13) - local_1d8)) {
          JS_ThrowTypeError((JSContext *)local_148.ptr,"Array loo long");
          goto LAB_001b2879;
        }
        local_1d0 = local_1d8;
      }
      local_38.float64 = local_148.float64;
      local_40 = local_1d0;
      iVar3 = (int)local_1d0;
      if (local_1d0 == (long)iVar3) {
        local_18.float64 = local_148.float64;
        local_8 = 0;
        local_50._4_4_ = uStack_c;
        local_50.int32 = iVar3;
        local_48 = 0;
        local_28 = 0;
        local_30 = local_50;
        local_1c = iVar3;
        local_10 = iVar3;
      }
      else {
        _local_60 = __JS_NewFloat64((JSContext *)local_148.ptr,(double)(long)local_1d0);
        local_30 = local_60;
        local_28 = local_58;
      }
      local_1a0 = local_30;
      local_198 = local_28;
      obj_03.tag._0_4_ = in_stack_fffffffffffffe00;
      obj_03.u = (JSValueUnion)uVar12;
      obj_03.tag._4_4_ = uVar13;
      len_val_00.tag._0_4_ = uVar11;
      len_val_00.u = (JSValueUnion)iVar10;
      len_val_00.tag._4_4_ = in_stack_fffffffffffffdf4;
      JVar6 = JS_ArraySpeciesCreate((JSContext *)CONCAT44(uVar9,flags),obj_03,len_val_00);
      local_250 = JVar6.u;
      local_180 = local_250;
      local_248 = JVar6.tag;
      local_178 = local_248;
      v_00.u._4_4_ = in_stack_fffffffffffffd3c;
      v_00.u.int32 = in_stack_fffffffffffffd38;
      v_00.tag = (int64_t)in_stack_fffffffffffffd40.ptr;
      JS_FreeValue(in_stack_fffffffffffffd30,v_00);
      v_04.tag = local_178;
      v_04.u.ptr = local_180.ptr;
      iVar3 = JS_IsException(v_04);
      if (iVar3 == 0) {
        local_1b8 = local_1b0;
        local_1c0 = local_1b0 + local_1d0;
        local_1c8 = (JSContext *)0x0;
        obj_05.tag = local_168;
        obj_05.u.float64 = local_170.float64;
        BVar4 = js_get_fast_array((JSContext *)local_148.ptr,obj_05,&local_1f0,
                                  (uint32_t *)&stack0xfffffffffffffe0c);
        if ((BVar4 != 0) &&
           (obj_04.tag = local_178, obj_04.u.ptr = local_180.ptr,
           BVar4 = js_is_fast_array((JSContext *)local_148.ptr,obj_04), BVar4 != 0)) {
          for (; in_stack_fffffffffffffd6f =
                      local_1b8 < local_1c0 && local_1b8 < (long)(ulong)in_stack_fffffffffffffe0c,
              local_1b8 < local_1c0 && local_1b8 < (long)(ulong)in_stack_fffffffffffffe0c;
              local_1b8 = local_1b8 + 1) {
            in_stack_fffffffffffffd58 = local_148;
            in_stack_fffffffffffffd60 = local_1c8;
            JVar6 = JS_DupValue((JSContext *)local_148.ptr,local_1f0[local_1b8]);
            in_stack_fffffffffffffda0 = JVar6.u;
            prop = (JSAtom)((ulong)_local_2d8 >> 0x20);
            _local_2d8 = CONCAT44(prop,0x4000);
            this_obj_01.u._7_1_ = in_stack_fffffffffffffd6f;
            this_obj_01.u._0_7_ = in_stack_fffffffffffffd68;
            this_obj_01.tag = (int64_t)in_stack_fffffffffffffd70.ptr;
            val_02.tag = (int64_t)in_stack_fffffffffffffd60;
            val_02.u.ptr = in_stack_fffffffffffffd58.ptr;
            iVar3 = JS_CreateDataPropertyUint32
                              (in_stack_fffffffffffffd50,this_obj_01,
                               (int64_t)in_stack_fffffffffffffd48,val_02,flags);
            if (iVar3 < 0) goto LAB_001b2879;
            local_1c8 = (JSContext *)((long)&(local_1c8->header).ref_count + 1);
          }
        }
        for (; lVar5 = _local_2d8, prop = (JSAtom)((ulong)_local_2d8 >> 0x20), local_1b8 < local_1c0
            ; local_1b8 = local_1b8 + 1) {
          obj_02.tag = (int64_t)in_stack_fffffffffffffda0.ptr;
          obj_02.u.float64 = in_stack_fffffffffffffd98.float64;
          local_1e4 = JS_TryGetPropertyInt64
                                (in_stack_fffffffffffffd90,obj_02,in_stack_fffffffffffffd80._8_8_,
                                 in_stack_fffffffffffffd80._0_8_);
          if (local_1e4 < 0) goto LAB_001b2879;
          if (local_1e4 != 0) {
            _local_2d8 = CONCAT44(prop,0x4000);
            this_obj_02.u._7_1_ = in_stack_fffffffffffffd6f;
            this_obj_02.u._0_7_ = in_stack_fffffffffffffd68;
            this_obj_02.tag = (int64_t)in_stack_fffffffffffffd70.ptr;
            val_03.tag = (int64_t)in_stack_fffffffffffffd60;
            val_03.u.float64 = in_stack_fffffffffffffd58.float64;
            iVar3 = JS_CreateDataPropertyUint32
                              (in_stack_fffffffffffffd50,this_obj_02,
                               (int64_t)in_stack_fffffffffffffd48,val_03,flags);
            lVar5 = _local_2d8;
            if (iVar3 < 0) goto LAB_001b2879;
          }
          _local_2d8 = lVar5;
          local_1c8 = (JSContext *)((long)&(local_1c8->header).ref_count + 1);
        }
        local_98.float64 = local_148.float64;
        local_a0 = local_1c8;
        iVar3 = (int)local_1c8;
        JVar7 = local_148;
        if (local_1c8 == (JSContext *)(long)iVar3) {
          local_78.float64 = local_148.float64;
          local_68 = 0;
          local_b0._4_4_ = uStack_6c;
          local_b0.int32 = iVar3;
          local_a8 = 0;
          local_88 = 0;
          local_90 = local_b0;
          local_7c = iVar3;
          local_70 = iVar3;
        }
        else {
          _local_c0 = __JS_NewFloat64((JSContext *)local_148.ptr,(double)(long)local_1c8);
          local_90 = local_c0;
          local_88 = local_b8;
        }
        this_obj.tag = (int64_t)JVar7.ptr;
        this_obj.u.ptr = in_stack_fffffffffffffd48.ptr;
        val_00.u._4_4_ = in_stack_fffffffffffffd3c;
        val_00.u.int32 = in_stack_fffffffffffffd38;
        val_00.tag = (int64_t)in_stack_fffffffffffffd40.ptr;
        JVar8 = local_90;
        iVar3 = JS_SetProperty(in_stack_fffffffffffffd30,this_obj,prop,val_00);
        if (-1 < iVar3) {
          if (local_15c == 0) {
LAB_001b283a:
            v_01.u._4_4_ = in_stack_fffffffffffffd3c;
            v_01.u.int32 = in_stack_fffffffffffffd38;
            v_01.tag = (int64_t)in_stack_fffffffffffffd40.ptr;
            JS_FreeValue(in_stack_fffffffffffffd30,v_01);
            local_130 = local_180.int32;
            uStack_12c = local_180._4_4_;
            local_128 = local_178;
            goto LAB_001b28ca;
          }
          local_1e0 = (local_1a8 + (ulong)uVar13) - local_1d8;
          if (uVar13 == local_1d8) {
LAB_001b2621:
            for (uVar14 = 0; uVar14 < uVar13; uVar14 = uVar14 + 1) {
              in_stack_fffffffffffffd48.ptr = (void *)(local_1b0 + (ulong)uVar14);
              in_stack_fffffffffffffd40 = local_148;
              JS_DupValue((JSContext *)local_148.ptr,
                          *(JSValue *)(local_158 + (ulong)(uVar14 + 2) * 0x10));
              this_obj_03.u._7_1_ = in_stack_fffffffffffffd6f;
              this_obj_03.u._0_7_ = in_stack_fffffffffffffd68;
              this_obj_03.tag = (int64_t)in_stack_fffffffffffffd70.ptr;
              val_04.tag = (int64_t)in_stack_fffffffffffffd60;
              val_04.u.float64 = in_stack_fffffffffffffd58.float64;
              iVar3 = JS_SetPropertyInt64((JSContext *)JVar7.ptr,this_obj_03,
                                          (int64_t)in_stack_fffffffffffffd48,val_04);
              if (iVar3 < 0) goto LAB_001b2879;
            }
            in_stack_fffffffffffffd38 = local_148.int32;
            in_stack_fffffffffffffd3c = local_148._4_4_;
            local_f8.float64 = local_148.float64;
            local_100 = local_1e0;
            iVar3 = (int)local_1e0;
            if (local_1e0 == iVar3) {
              local_d8.float64 = local_148.float64;
              local_c8 = 0;
              local_110._4_4_ = uStack_cc;
              local_110.int32 = iVar3;
              local_108 = 0;
              local_e8 = 0;
              local_f0 = local_110;
              local_dc = iVar3;
              local_d0 = iVar3;
            }
            else {
              _local_120 = __JS_NewFloat64((JSContext *)local_148.ptr,(double)local_1e0);
              local_f0 = local_120;
              local_e8 = local_118;
            }
            this_obj_00.tag = (int64_t)JVar7.ptr;
            this_obj_00.u.float64 = in_stack_fffffffffffffd48.float64;
            val_01.u._4_4_ = in_stack_fffffffffffffd3c;
            val_01.u.int32 = in_stack_fffffffffffffd38;
            val_01.tag = (int64_t)in_stack_fffffffffffffd40.ptr;
            iVar3 = JS_SetProperty(in_stack_fffffffffffffd30,this_obj_00,prop,val_01);
            if (-1 < iVar3) goto LAB_001b283a;
          }
          else {
            obj_01.tag = in_stack_fffffffffffffd78;
            obj_01.u.ptr = in_stack_fffffffffffffd70.ptr;
            iVar3 = JS_CopySubArray((JSContext *)
                                    CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                                    obj_01,(int64_t)in_stack_fffffffffffffd60,
                                    (int64_t)in_stack_fffffffffffffd58,(int64_t)JVar7,JVar8.int32);
            if (-1 < iVar3) {
              local_1b8 = local_1a8;
              do {
                lVar5 = local_1b8 + -1;
                bVar1 = local_1b8 <= local_1e0;
                local_1b8 = lVar5;
                if (bVar1) goto LAB_001b2621;
                obj_00.tag = (int64_t)in_stack_fffffffffffffd58.ptr;
                obj_00.u.ptr = JVar7.ptr;
                iVar3 = JS_DeletePropertyInt64
                                  ((JSContext *)in_stack_fffffffffffffd48.ptr,obj_00,
                                   (int64_t)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
              } while (-1 < iVar3);
            }
          }
        }
      }
    }
  }
LAB_001b2879:
  v_02.u._4_4_ = in_stack_fffffffffffffd3c;
  v_02.u.int32 = in_stack_fffffffffffffd38;
  v_02.tag = (int64_t)in_stack_fffffffffffffd40.ptr;
  JS_FreeValue(in_stack_fffffffffffffd30,v_02);
  v_03.u._4_4_ = in_stack_fffffffffffffd3c;
  v_03.u.int32 = in_stack_fffffffffffffd38;
  v_03.tag = (int64_t)in_stack_fffffffffffffd40.ptr;
  JS_FreeValue(in_stack_fffffffffffffd30,v_03);
  local_130 = 0;
  local_128 = 6;
LAB_001b28ca:
  JVar2.u._4_4_ = uStack_12c;
  JVar2.u.int32 = local_130;
  JVar2.tag = local_128;
  return JVar2;
}

Assistant:

static JSValue js_array_slice(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv, int splice)
{
    JSValue obj, arr, val, len_val;
    int64_t len, start, k, final, n, count, del_count, new_len;
    int kPresent;
    JSValue *arrp;
    uint32_t count32, i, item_count;

    arr = JS_UNDEFINED;
    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    if (JS_ToInt64Clamp(ctx, &start, argv[0], 0, len, len))
        goto exception;

    if (splice) {
        if (argc == 0) {
            item_count = 0;
            del_count = 0;
        } else
        if (argc == 1) {
            item_count = 0;
            del_count = len - start;
        } else {
            item_count = argc - 2;
            if (JS_ToInt64Clamp(ctx, &del_count, argv[1], 0, len - start, 0))
                goto exception;
        }
        if (len + item_count - del_count > MAX_SAFE_INTEGER) {
            JS_ThrowTypeError(ctx, "Array loo long");
            goto exception;
        }
        count = del_count;
    } else {
        item_count = 0; /* avoid warning */
        final = len;
        if (!JS_IsUndefined(argv[1])) {
            if (JS_ToInt64Clamp(ctx, &final, argv[1], 0, len, len))
                goto exception;
        }
        count = max_int64(final - start, 0);
    }
    len_val = JS_NewInt64(ctx, count);
    arr = JS_ArraySpeciesCreate(ctx, obj, len_val);
    JS_FreeValue(ctx, len_val);
    if (JS_IsException(arr))
        goto exception;

    k = start;
    final = start + count;
    n = 0;
    /* The fast array test on arr ensures that
       JS_CreateDataPropertyUint32() won't modify obj in case arr is
       an exotic object */
    /* Special case fast arrays */
    if (js_get_fast_array(ctx, obj, &arrp, &count32) &&
        js_is_fast_array(ctx, arr)) {
        /* XXX: should share code with fast array constructor */
        for (; k < final && k < count32; k++, n++) {
            if (JS_CreateDataPropertyUint32(ctx, arr, n, JS_DupValue(ctx, arrp[k]), JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    /* Copy the remaining elements if any (handle case of inherited properties) */
    for (; k < final; k++, n++) {
        kPresent = JS_TryGetPropertyInt64(ctx, obj, k, &val);
        if (kPresent < 0)
            goto exception;
        if (kPresent) {
            if (JS_CreateDataPropertyUint32(ctx, arr, n, val, JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    if (JS_SetProperty(ctx, arr, JS_ATOM_length, JS_NewInt64(ctx, n)) < 0)
        goto exception;

    if (splice) {
        new_len = len + item_count - del_count;
        if (item_count != del_count) {
            if (JS_CopySubArray(ctx, obj, start + item_count,
                                start + del_count, len - (start + del_count),
                                item_count <= del_count ? +1 : -1) < 0)
                goto exception;

            for (k = len; k-- > new_len; ) {
                if (JS_DeletePropertyInt64(ctx, obj, k, JS_PROP_THROW) < 0)
                    goto exception;
            }
        }
        for (i = 0; i < item_count; i++) {
            if (JS_SetPropertyInt64(ctx, obj, start + i, JS_DupValue(ctx, argv[i + 2])) < 0)
                goto exception;
        }
        if (JS_SetProperty(ctx, obj, JS_ATOM_length, JS_NewInt64(ctx, new_len)) < 0)
            goto exception;
    }
    JS_FreeValue(ctx, obj);
    return arr;

 exception:
    JS_FreeValue(ctx, obj);
    JS_FreeValue(ctx, arr);
    return JS_EXCEPTION;
}